

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void GenerateRandomFloat(float *data,size_t num)

{
  ulong in_RSI;
  long in_RDI;
  size_t i;
  uniform_real_distribution<double> dist;
  mt19937 e;
  random_device rd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd898;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd8a0;
  undefined8 local_2748;
  random_device *in_stack_ffffffffffffd8e0;
  
  std::random_device::random_device(in_stack_ffffffffffffd8e0);
  std::random_device::operator()((random_device *)0x112d03);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffd8a0,(result_type)in_stack_ffffffffffffd898);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)in_stack_ffffffffffffd8a0,
             (double)in_stack_ffffffffffffd898,5.56161298407512e-318);
  for (local_2748 = 0; local_2748 < in_RSI; local_2748 = local_2748 + 1) {
    in_stack_ffffffffffffd8a0 =
         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)in_stack_ffffffffffffd8a0,
                       in_stack_ffffffffffffd898);
    *(float *)(in_RDI + local_2748 * 4) = (float)(double)in_stack_ffffffffffffd8a0;
  }
  std::random_device::~random_device((random_device *)0x112dba);
  return;
}

Assistant:

void GenerateRandomFloat(float *data, size_t num) {
  std::random_device rd;
  std::mt19937 e(rd());
  std::uniform_real_distribution<> dist(0, 10);

  for (size_t i = 0; i < num; i++) {
    data[i] = dist(e);
  }
}